

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Int64(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
        *this,int64_t i)

{
  int64_t *piVar1;
  uint uVar2;
  
  piVar1 = (int64_t *)(this->stack_).stackTop_;
  if ((this->stack_).stackEnd_ <= piVar1 + 3) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
    piVar1 = (int64_t *)(this->stack_).stackTop_;
  }
  (this->stack_).stackTop_ = (char *)(piVar1 + 3);
  piVar1[1] = 0;
  *(undefined4 *)(piVar1 + 2) = 0x1206;
  *piVar1 = i;
  if (i < 0) {
    uVar2 = 0x1606;
    if ((ulong)i < 0xffffffff80000000) {
      return true;
    }
  }
  else {
    uVar2 = 0x3e06;
    if ((i & 0xffffffff80000000U) != 0) {
      uVar2 = (uint)((ulong)i >> 0x20 == 0) << 0xb | 0x3206;
    }
  }
  *(uint *)(piVar1 + 2) = uVar2;
  return true;
}

Assistant:

bool Int64(int64_t i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }